

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signingprovider.cpp
# Opt level: O0

NodeInfo * TaprootBuilder::Combine(NodeInfo *a,NodeInfo *b)

{
  long lVar1;
  Span<const_unsigned_char> b_00;
  bool bVar2;
  size_t sVar3;
  long in_RDX;
  LeafInfo *in_RDI;
  long in_FS_OFFSET;
  LeafInfo *leaf_1;
  vector<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_> *__range1_1;
  LeafInfo *leaf;
  vector<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_> *__range1;
  NodeInfo *ret;
  iterator __end1_1;
  iterator __begin1_1;
  iterator __end1;
  iterator __begin1;
  NodeInfo *in_stack_ffffffffffffff28;
  uint256 *in_stack_ffffffffffffff30;
  LeafInfo *__args;
  reference in_stack_ffffffffffffff48;
  Span<const_unsigned_char> in_stack_ffffffffffffff58;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __args = in_RDI;
  NodeInfo::NodeInfo(in_stack_ffffffffffffff28);
  std::vector<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_>::begin
            ((vector<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_> *)
             in_stack_ffffffffffffff30);
  std::vector<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_>::end
            ((vector<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_> *)
             in_stack_ffffffffffffff30);
  while (bVar2 = __gnu_cxx::
                 operator==<TaprootBuilder::LeafInfo_*,_std::vector<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_>_>
                           ((__normal_iterator<TaprootBuilder::LeafInfo_*,_std::vector<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_>_>
                             *)in_RDI,
                            (__normal_iterator<TaprootBuilder::LeafInfo_*,_std::vector<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_>_>
                             *)in_stack_ffffffffffffff30), ((bVar2 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<TaprootBuilder::LeafInfo_*,_std::vector<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_>_>
    ::operator*((__normal_iterator<TaprootBuilder::LeafInfo_*,_std::vector<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_>_>
                 *)in_stack_ffffffffffffff28);
    std::vector<uint256,_std::allocator<uint256>_>::push_back
              ((vector<uint256,_std::allocator<uint256>_> *)in_RDI,in_stack_ffffffffffffff30);
    std::vector<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_>::
    emplace_back<TaprootBuilder::LeafInfo>
              ((vector<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_> *)
               in_stack_ffffffffffffff48,__args);
    __gnu_cxx::
    __normal_iterator<TaprootBuilder::LeafInfo_*,_std::vector<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_>_>
    ::operator++((__normal_iterator<TaprootBuilder::LeafInfo_*,_std::vector<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_>_>
                  *)in_stack_ffffffffffffff28);
  }
  sVar3 = in_RDX + 0x20;
  std::vector<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_>::begin
            ((vector<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_> *)
             in_stack_ffffffffffffff30);
  std::vector<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_>::end
            ((vector<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_> *)
             in_stack_ffffffffffffff30);
  while (bVar2 = __gnu_cxx::
                 operator==<TaprootBuilder::LeafInfo_*,_std::vector<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_>_>
                           ((__normal_iterator<TaprootBuilder::LeafInfo_*,_std::vector<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_>_>
                             *)in_RDI,
                            (__normal_iterator<TaprootBuilder::LeafInfo_*,_std::vector<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_>_>
                             *)in_stack_ffffffffffffff30), ((bVar2 ^ 0xffU) & 1) != 0) {
    in_stack_ffffffffffffff48 =
         __gnu_cxx::
         __normal_iterator<TaprootBuilder::LeafInfo_*,_std::vector<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_>_>
         ::operator*((__normal_iterator<TaprootBuilder::LeafInfo_*,_std::vector<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_>_>
                      *)in_stack_ffffffffffffff28);
    std::vector<uint256,_std::allocator<uint256>_>::push_back
              ((vector<uint256,_std::allocator<uint256>_> *)in_RDI,in_stack_ffffffffffffff30);
    std::vector<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_>::
    emplace_back<TaprootBuilder::LeafInfo>
              ((vector<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_> *)
               in_stack_ffffffffffffff48,__args);
    __gnu_cxx::
    __normal_iterator<TaprootBuilder::LeafInfo_*,_std::vector<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_>_>
    ::operator++((__normal_iterator<TaprootBuilder::LeafInfo_*,_std::vector<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_>_>
                  *)in_stack_ffffffffffffff28);
  }
  Span<const_unsigned_char>::Span<uint256>
            ((Span<const_unsigned_char> *)in_RDI,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28
            );
  Span<const_unsigned_char>::Span<uint256>
            ((Span<const_unsigned_char> *)in_RDI,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28
            );
  b_00.m_size = sVar3;
  b_00.m_data = (uchar *)in_stack_ffffffffffffff48;
  ComputeTapbranchHash(in_stack_ffffffffffffff58,b_00);
  *(undefined8 *)(((uint256 *)&in_RDI->script)->super_base_blob<256U>).m_data._M_elems = local_28;
  *(undefined8 *)((((uint256 *)&in_RDI->script)->super_base_blob<256U>).m_data._M_elems + 8) =
       local_20;
  *(undefined8 *)((((uint256 *)&in_RDI->script)->super_base_blob<256U>).m_data._M_elems + 0x10) =
       local_18;
  *(undefined8 *)&in_RDI->leaf_version = local_10;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (NodeInfo *)__args;
}

Assistant:

TaprootBuilder::NodeInfo TaprootBuilder::Combine(NodeInfo&& a, NodeInfo&& b)
{
    NodeInfo ret;
    /* Iterate over all tracked leaves in a, add b's hash to their Merkle branch, and move them to ret. */
    for (auto& leaf : a.leaves) {
        leaf.merkle_branch.push_back(b.hash);
        ret.leaves.emplace_back(std::move(leaf));
    }
    /* Iterate over all tracked leaves in b, add a's hash to their Merkle branch, and move them to ret. */
    for (auto& leaf : b.leaves) {
        leaf.merkle_branch.push_back(a.hash);
        ret.leaves.emplace_back(std::move(leaf));
    }
    ret.hash = ComputeTapbranchHash(a.hash, b.hash);
    return ret;
}